

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O0

void cinatra::update<void>(sha1_context *ctx,void *message,size_t size)

{
  unsigned_long *puVar1;
  unsigned_long in_RDX;
  void *in_RSI;
  long *in_RDI;
  uint32_t block [16];
  unsigned_long n;
  uint8_t *p;
  uint32_t auStackY_78 [8];
  uint32_t *in_stack_ffffffffffffffa8;
  uint32_t *in_stack_ffffffffffffffb0;
  unsigned_long local_30;
  size_t local_28;
  void *local_20;
  unsigned_long local_18 [2];
  long *local_8;
  
  local_20 = in_RSI;
  local_18[0] = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    local_30 = 0x40 - *local_8;
    puVar1 = std::min<unsigned_long>(local_18,&local_30);
    local_28 = *puVar1;
    memcpy((void *)((long)local_8 + *local_8 + 0x24),local_20,local_28);
    *local_8 = local_28 + *local_8;
    if (*local_8 != 0x40) break;
    local_20 = (void *)((long)local_20 + local_28);
    local_18[0] = local_18[0] - local_28;
    *local_8 = 0;
    sha1::make_block((uint8_t *)((long)local_8 + 0x24),auStackY_78);
    sha1::transform<void>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_8[1] = local_8[1] + 1;
  }
  return;
}

Assistant:

inline void update(sha1_context &ctx, void const *message,
                   std::size_t size) noexcept {
  auto p = reinterpret_cast<std::uint8_t const *>(message);
  for (;;) {
    auto const n = (std::min)(size, sizeof(ctx.buf) - ctx.buflen);
    std::memcpy(ctx.buf + ctx.buflen, p, n);
    ctx.buflen += n;
    if (ctx.buflen != 64)
      return;
    p += n;
    size -= n;
    ctx.buflen = 0;
    std::uint32_t block[sha1::BLOCK_INTS];
    sha1::make_block(ctx.buf, block);
    sha1::transform(ctx.digest, block);
    ++ctx.blocks;
  }
}